

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_div_mips64el(float64 a,float64 b,float_status *s)

{
  union_float64 a_00;
  _Bool _Var1;
  byte bVar2;
  ulong uVar3;
  float64 fVar4;
  float_status *s_local;
  float64 b_local;
  float64 a_local;
  union_float64 ur;
  union_float64 ub;
  union_float64 ua;
  code *local_50;
  code *local_48;
  code *local_40;
  code *local_38;
  code *local_30;
  float_status *local_28;
  float64 local_20;
  float64 local_18;
  
  local_30 = hard_f64_div;
  local_38 = soft_f64_div;
  local_40 = f64_div_pre;
  local_48 = f64_div_post;
  local_50 = (code *)0x0;
  ua.s = 0;
  ur.s = b;
  ub.s = a;
  local_28 = s;
  local_20 = b;
  local_18 = a;
  _Var1 = can_use_fpu(s);
  if (((_Var1 ^ 0xffU) & 1) == 0) {
    float64_input_flush2(&ub.s,&ur.s,local_28);
    bVar2 = (*local_40)(ub.s,ur.s);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      if ((local_50 != (code *)0x0) && (uVar3 = (*local_50)(ub.s,ur.s), (uVar3 & 1) != 0)) {
        fVar4 = (*ua.s)(ub.s,ur.s,local_28);
        return fVar4;
      }
      a_00.s = (*local_30)((int)ub.s,ur.s);
      _Var1 = f64_is_inf(a_00);
      if (_Var1) {
        local_28->float_exception_flags = local_28->float_exception_flags | 8;
        return a_00.s;
      }
      if (2.2250738585072014e-308 < ABS(a_00.h)) {
        return a_00.s;
      }
      if ((local_48 != (code *)0x0) && (uVar3 = (*local_48)(ub.s,ur.s), (uVar3 & 1) == 0)) {
        return a_00.s;
      }
    }
  }
  fVar4 = (*local_38)(ub.s,ur.s,local_28);
  return fVar4;
}

Assistant:

float64 QEMU_FLATTEN
float64_div(float64 a, float64 b, float_status *s)
{
    return float64_gen2(a, b, s, hard_f64_div, soft_f64_div,
                        f64_div_pre, f64_div_post, NULL, NULL);
}